

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::cast_to_regexp(anon_unknown_35 *this,value *v)

{
  bool bVar1;
  gc_heap_ptr_untyped *p;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  gc_heap_ptr<mjs::regexp_object> gVar2;
  object_ptr o;
  gc_heap_ptr_untyped local_20;
  
  if (v->type_ == object) {
    p = &value::object_value(v)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_20,p);
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>(&local_20);
    if (bVar1) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,&local_20);
    }
    else {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0;
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
    in_RDX = extraout_RDX;
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined4 *)(this + 8) = 0;
  }
  gVar2.super_gc_heap_ptr_untyped._8_8_ = in_RDX;
  gVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::regexp_object>)gVar2.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<regexp_object> cast_to_regexp(const value& v) {
    if (v.type() != value_type::object) {
        return nullptr;
    }
    auto o = v.object_value();
    if (!o.has_type<regexp_object>()) {
        return nullptr;
    }
    return gc_heap_ptr<regexp_object>{o};
}